

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_resetNotEqualByTestVariable_Test::~Equality_resetNotEqualByTestVariable_Test
          (Equality_resetNotEqualByTestVariable_Test *this)

{
  Equality_resetNotEqualByTestVariable_Test *this_local;
  
  ~Equality_resetNotEqualByTestVariable_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, resetNotEqualByTestVariable)
{
    libcellml::ResetPtr r1 = createInitialisedReset();
    libcellml::ResetPtr r2 = createInitialisedReset();

    libcellml::VariablePtr tv1 = libcellml::Variable::create("vTestA");
    r1->setTestVariable(tv1);

    EXPECT_FALSE(r1->equals(r2));
    EXPECT_FALSE(r2->equals(r1));
}